

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O3

void llama_sampler_infill_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  float fVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  llama_token lVar8;
  size_t sVar9;
  llama_token_data *plVar10;
  float *pfVar11;
  llama_token_data *plVar12;
  size_t sVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  
  puVar2 = (undefined8 *)smpl->ctx;
  llama_sampler_softmax_impl(cur_p);
  if (cur_p->size != 0) {
    plVar10 = cur_p->data;
    fVar20 = 0.0;
    lVar15 = 0;
    fVar21 = 0.0;
    uVar16 = 0;
    do {
      bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                  *(llama_token *)((long)&plVar10->id + lVar15));
      plVar10 = cur_p->data;
      fVar1 = *(float *)((long)&plVar10->p + lVar15);
      if (bVar5) {
        fVar21 = fVar21 + fVar1;
      }
      else {
        fVar20 = fVar20 + fVar1;
      }
      uVar14 = cur_p->size;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + 0xc;
    } while (uVar16 < uVar14);
    if (fVar20 < fVar21 * 3.0 * (float)uVar14) {
      cur_p->size = 0;
      if (uVar14 == 0) {
        return;
      }
      fVar20 = 0.0;
      lVar15 = 0;
      do {
        bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                    *(llama_token *)((long)&cur_p->data->id + lVar15));
        if (bVar5) {
          plVar10 = cur_p->data;
          fVar20 = fVar20 + *(float *)((long)&plVar10->p + lVar15);
          sVar9 = cur_p->size;
          cur_p->size = sVar9 + 1;
          plVar10[sVar9].p = *(float *)((long)&plVar10->p + lVar15);
          uVar3 = *(undefined8 *)((long)&plVar10->id + lVar15);
          plVar10[sVar9].id = (int)uVar3;
          plVar10[sVar9].logit = (float)(int)((ulong)uVar3 >> 0x20);
        }
        lVar15 = lVar15 + 0xc;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      sVar9 = cur_p->size;
      if (sVar9 == 0) {
        return;
      }
      pfVar11 = &cur_p->data->p;
      do {
        *pfVar11 = *pfVar11 / fVar20;
        pfVar11 = pfVar11 + 3;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
      return;
    }
    if (uVar14 != 0) {
      uVar16 = 0;
      do {
        plVar10 = cur_p->data;
        if (-INFINITY < plVar10[uVar16].logit) {
          plVar12 = plVar10 + uVar16;
          lVar15 = 0;
          uVar17 = 0;
          do {
            if ((uVar16 != uVar17) && (-INFINITY < *(float *)((long)&plVar10->logit + lVar15))) {
              uVar6 = llama_vocab::token_to_piece
                                ((llama_vocab *)*puVar2,plVar12->id,(char *)puVar2[1],
                                 *(int *)(puVar2 + 2) - (int)(char *)puVar2[1],0,false);
              if ((int)uVar6 < 0) {
                std::vector<char,_std::allocator<char>_>::resize
                          ((vector<char,_std::allocator<char>_> *)(puVar2 + 1),(long)(int)uVar6);
                uVar6 = llama_vocab::token_to_piece
                                  ((llama_vocab *)*puVar2,cur_p->data[uVar16].id,(char *)puVar2[1],
                                   *(int *)(puVar2 + 2) - (int)(char *)puVar2[1],0,false);
              }
              iVar7 = llama_vocab::token_to_piece
                                ((llama_vocab *)*puVar2,
                                 *(llama_token *)((long)&cur_p->data->id + lVar15),(char *)puVar2[4]
                                 ,*(int *)(puVar2 + 5) - (int)(char *)puVar2[4],0,false);
              if (iVar7 < 0) {
                std::vector<char,_std::allocator<char>_>::resize
                          ((vector<char,_std::allocator<char>_> *)(puVar2 + 4),(long)iVar7);
                iVar7 = llama_vocab::token_to_piece
                                  ((llama_vocab *)*puVar2,
                                   *(llama_token *)((long)&cur_p->data->id + lVar15),
                                   (char *)puVar2[4],*(int *)(puVar2 + 5) - (int)(char *)puVar2[4],0
                                   ,false);
              }
              if (((0 < (int)uVar6) && ((int)uVar6 <= iVar7)) &&
                 (iVar7 = bcmp((((vector<char,_std::allocator<char>_> *)(puVar2 + 1))->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start,
                               (((vector<char,_std::allocator<char>_> *)(puVar2 + 4))->
                               super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start,(ulong)uVar6), iVar7 == 0)) {
                plVar10 = cur_p->data;
                fVar20 = *(float *)((long)&plVar10->p + lVar15);
                bVar5 = fVar20 != plVar10[uVar16].p;
                bVar4 = plVar10[uVar16].p <= fVar20;
                uVar14 = uVar16;
                if (bVar4 && bVar5) {
                  uVar14 = uVar17;
                }
                iVar7 = (int)uVar17;
                if (bVar4 && bVar5) {
                  iVar7 = (int)uVar16;
                }
                plVar10[(int)uVar14].p = plVar10[iVar7].p + plVar10[(int)uVar14].p;
                plVar10[iVar7].logit = -INFINITY;
                plVar10[iVar7].p = 0.0;
              }
            }
            uVar17 = uVar17 + 1;
            uVar14 = cur_p->size;
            if (uVar14 <= uVar17) break;
            plVar10 = cur_p->data;
            plVar12 = plVar10 + uVar16;
            lVar15 = lVar15 + 0xc;
          } while (-INFINITY < plVar12->logit);
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar14);
      cur_p->size = 0;
      if (uVar14 != 0) {
        fVar20 = 0.0;
        lVar15 = 0;
        lVar18 = 0;
        do {
          bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                      *(llama_token *)((long)&cur_p->data->id + lVar15));
          plVar10 = cur_p->data;
          fVar21 = *(float *)((long)&plVar10->p + lVar15);
          if ((bVar5) || (0.2 <= fVar21)) {
            lVar18 = lVar18 + (ulong)!bVar5;
            fVar20 = fVar20 + fVar21;
            sVar9 = cur_p->size;
            cur_p->size = sVar9 + 1;
            plVar10[sVar9].p = *(float *)((long)&plVar10->p + lVar15);
            uVar3 = *(undefined8 *)((long)&plVar10->id + lVar15);
            plVar10[sVar9].id = (int)uVar3;
            plVar10[sVar9].logit = (float)(int)((ulong)uVar3 >> 0x20);
          }
          lVar15 = lVar15 + 0xc;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
        if (lVar18 != 0) {
          sVar9 = cur_p->size;
          if (sVar9 == 0) {
            return;
          }
          pfVar11 = &cur_p->data->p;
          sVar13 = sVar9;
          do {
            *pfVar11 = *pfVar11 / fVar20;
            pfVar11 = pfVar11 + 3;
            sVar13 = sVar13 - 1;
          } while (sVar13 != 0);
          lVar18 = lVar18 + 1;
          auVar19._8_4_ = (int)((ulong)lVar18 >> 0x20);
          auVar19._0_8_ = lVar18;
          auVar19._12_4_ = 0x45300000;
          cur_p->size = 0;
          fVar20 = 0.0;
          lVar15 = 0;
          do {
            bVar5 = llama_vocab::is_eog((llama_vocab *)*puVar2,
                                        *(llama_token *)((long)&cur_p->data->id + lVar15));
            plVar10 = cur_p->data;
            fVar21 = *(float *)((long)&plVar10->p + lVar15);
            if ((bVar5) ||
               ((float)(1.0 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar18) - 4503599627370496.0))) <=
                fVar21)) {
              fVar20 = fVar20 + fVar21;
              sVar13 = cur_p->size;
              cur_p->size = sVar13 + 1;
              plVar10[sVar13].p = *(float *)((long)&plVar10->p + lVar15);
              uVar3 = *(undefined8 *)((long)&plVar10->id + lVar15);
              plVar10[sVar13].id = (int)uVar3;
              plVar10[sVar13].logit = (float)(int)((ulong)uVar3 >> 0x20);
            }
            lVar15 = lVar15 + 0xc;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
          sVar9 = cur_p->size;
          if (sVar9 == 0) {
            return;
          }
          pfVar11 = &cur_p->data->p;
          do {
            *pfVar11 = *pfVar11 / fVar20;
            pfVar11 = pfVar11 + 3;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
          return;
        }
      }
    }
  }
  cur_p->size = 1;
  lVar8 = llama_vocab::token_eot((llama_vocab *)*puVar2);
  plVar10 = cur_p->data;
  plVar10->id = lVar8;
  plVar10->logit = 1.0;
  return;
}

Assistant:

static void llama_sampler_infill_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_infill *) smpl->ctx;

    llama_sampler_softmax_impl(cur_p);

#if defined(GGML_DEBUG_SAMPLER_INFILL)
#define LOG_DBG_CUR LLAMA_LOG_DEBUG
#else
#define LOG_DBG_CUR(...)
#endif

    for (size_t i = 0; i < cur_p->size; ++i) {
        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    float p_txt_sum = 0.0f;
    float p_eog_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        if (ctx->vocab->is_eog(cur_p->data[i].id)) {
            p_eog_sum += cur_p->data[i].p;
        } else {
            p_txt_sum += cur_p->data[i].p;
        }
    }

    const float rat = p_eog_sum == 0.0 ? INFINITY : p_txt_sum / p_eog_sum; GGML_UNUSED(rat);

    LOG_DBG_CUR("%s: p_txt_sum = %.2f, p_eog_sum = %.2f, rat = %.2f, n = %zu\n", __func__, p_txt_sum, p_eog_sum, rat, cur_p->size);

    if (3*p_eog_sum*cur_p->size > p_txt_sum) {
        LOG_DBG_CUR("%s: the ratio p_txt/p_eog = %.2f is too low -> sampling EOG\n", __func__, p_txt_sum/p_eog_sum);

        // keep just the EOG tokens
        const auto size_org = cur_p->size;

        cur_p->size = 0;

        float p_sum = 0.0f;

        for (size_t i = 0; i < size_org; ++i) {
            if (ctx->vocab->is_eog(cur_p->data[i].id)) {
                p_sum += cur_p->data[i].p;

                cur_p->data[cur_p->size++] = cur_p->data[i];
            }
        }

        // normalize probs
        for (size_t i = 0; i < cur_p->size; ++i) {
            cur_p->data[i].p /= p_sum;
        }

        return;
    }

    size_t n_combined = 0; GGML_UNUSED(n_combined);

    // combine tokens with common prefix
    for (size_t i0 = 0; i0 < cur_p->size; ++i0) {
        for (size_t i1 = 0; i1 < cur_p->size; ++i1) {
            if (cur_p->data[i0].logit == -INFINITY) {
                break;
            }

            if (i0 == i1 || cur_p->data[i1].logit == -INFINITY) {
                continue;
            }

            int len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
            if (len0 < 0) {
                ctx->buf0.resize(len0);
                len0 = ctx->vocab->token_to_piece(cur_p->data[i0].id, ctx->buf0.data(), ctx->buf0.size(), 0, false);
                assert(len0 > 0);
            }

            int len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
            if (len1 < 0) {
                ctx->buf1.resize(len1);
                len1 = ctx->vocab->token_to_piece(cur_p->data[i1].id, ctx->buf1.data(), ctx->buf1.size(), 0, false);
                assert(len1 > 0);
            }

            // token i0 is a prefix of token i1
            if (len0 > 0 && len0 <= len1 && memcmp(ctx->buf0.data(), ctx->buf1.data(), len0) == 0) {
                int dst = i0;
                int src = i1;

                // merge into the token with higher probability
                if (cur_p->data[i1].p > cur_p->data[i0].p) {
                    std::swap(dst, src);
                }

                cur_p->data[dst].p += cur_p->data[src].p;
                cur_p->data[src].logit = -INFINITY;
                cur_p->data[src].p     = 0.0f;

                n_combined++;
            }
        }
    }

    size_t n_non_eog = 0;

    size_t size_org = cur_p->size;

    float p_sum = 0.0f;
    float thold = 0.2f;

    cur_p->size = 0;

    LOG_DBG_CUR("%s: n_combined = %zu, applying thold = %.3f\n", __func__, n_combined, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        if (!is_eog) {
            ++n_non_eog;
        }

        p_sum += cur_p->data[i].p;

        // keep this token
        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    LOG_DBG_CUR("%s: n_non_eog = %zu\n", __func__, n_non_eog);

    // if no non-EOG tokens are left -> reduce cur_p to single EOT token
    if (n_non_eog == 0) {
        cur_p->size = 1;
        cur_p->data[0].id = ctx->vocab->token_eot();
        cur_p->data[0].logit = 1.0f;

        return;
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

    size_org = cur_p->size;
    p_sum = 0.0f;
    thold = 1.0/(n_non_eog + 1);

    cur_p->size = 0;

    LOG_DBG_CUR("%s: applying thold = %.3f\n", __func__, thold);

    for (size_t i = 0; i < size_org; ++i) {
        const bool is_eog = ctx->vocab->is_eog(cur_p->data[i].id);

        if (cur_p->data[i].p < thold && !is_eog) {
            continue;
        }

        p_sum += cur_p->data[i].p;

        cur_p->data[cur_p->size++] = cur_p->data[i];
    }

    // normalize probs
    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= p_sum;

        LOG_DBG_CUR("%s: cur_p[%3zu] = { id: %6d, p: %.6f, logit: %6.3f }\n", __func__, i, cur_p->data[i].id, cur_p->data[i].p, cur_p->data[i].logit);
    }

#undef LOG_DBG_CUR
}